

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidConvolution3DNoBias(void)

{
  RepeatedField<long> *this;
  RepeatedField<float> *this_00;
  uint uVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  GRULayerParams *pGVar5;
  bool bVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  NeuralNetworkLayer *pNVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  void *pvVar13;
  Convolution3DLayerParams *pCVar14;
  WeightParams *pWVar15;
  float *pfVar16;
  ostream *poVar17;
  undefined8 *puVar18;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar19;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  uint32_t size;
  uint uVar20;
  int iVar21;
  Arena *pAVar22;
  Model m1;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar3 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001925fd:
    pRVar19 = &(MStack_78.description_)->input_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar21 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar21) goto LAB_001925fd;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar13 = pRVar3->elements[iVar21];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"input",puVar18);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  this = &pAVar8->shape_;
  uVar1 = (pAVar8->shape_).current_size_;
  uVar2 = (pAVar8->shape_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar1] = 1;
  uVar20 = uVar1 + 1;
  (pAVar8->shape_).current_size_ = uVar20;
  uVar2 = (pAVar8->shape_).total_size_;
  if (uVar20 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar20] = 3;
  uVar20 = uVar1 + 2;
  (pAVar8->shape_).current_size_ = uVar20;
  uVar2 = (pAVar8->shape_).total_size_;
  if (uVar20 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar20] = 0x20;
  uVar20 = uVar1 + 3;
  (pAVar8->shape_).current_size_ = uVar20;
  uVar2 = (pAVar8->shape_).total_size_;
  if (uVar20 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar20] = 100;
  uVar20 = uVar1 + 4;
  (pAVar8->shape_).current_size_ = uVar20;
  uVar2 = (pAVar8->shape_).total_size_;
  if (uVar20 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar20] = 100;
  this->current_size_ = uVar1 + 5;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar3 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001927c1:
    pRVar19 = &(MStack_78.description_)->output_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar21 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar21) goto LAB_001927c1;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar13 = pRVar3->elements[iVar21];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"probs",puVar18);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar22 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar22);
  }
  (MStack_78.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001928b8:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar11 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_01,pNVar11);
  }
  else {
    iVar21 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar21) goto LAB_001928b8;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar21 + 1;
    pNVar11 = (NeuralNetworkLayer *)pRVar3->elements[iVar21];
  }
  pRVar3 = (pNVar11->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001928f0:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->input_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar21 = (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar21) goto LAB_001928f0;
    (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar13 = pRVar3->elements[iVar21];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3cb973);
  pRVar3 = (pNVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar21 = (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar21 < pRVar3->allocated_size) {
      (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
      pvVar13 = pRVar3->elements[iVar21];
      goto LAB_0019295a;
    }
  }
  pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar11->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar11->output_).super_RepeatedPtrFieldBase,pbVar12);
LAB_0019295a:
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3b872d);
  if (pNVar11->_oneof_case_[0] != 0x5bf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar11);
    pNVar11->_oneof_case_[0] = 0x5bf;
    uVar4 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pCVar14 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::Convolution3DLayerParams>(pAVar22);
    (pNVar11->layer_).convolution3d_ = pCVar14;
  }
  pGVar5 = (pNVar11->layer_).gru_;
  *(undefined8 *)((long)&pGVar5->outputgateweightmatrix_ + 4) = 0x100000003;
  *(undefined4 *)&pGVar5->outputgateweightmatrix_ = 3;
  *(undefined8 *)((long)&pGVar5->updategaterecursionmatrix_ + 4) = 0x300000003;
  *(undefined4 *)((long)&pGVar5->resetgaterecursionmatrix_ + 4) = 3;
  pGVar5->outputgaterecursionmatrix_ = (WeightParams *)0x100000001;
  pGVar5->updategatebiasvector_ = (WeightParams *)0x100000001;
  pGVar5->resetgatebiasvector_ = (WeightParams *)0x100000001;
  *(undefined8 *)((long)&pGVar5->outputgatebiasvector_ + 4) = 0;
  *(undefined8 *)((long)&pGVar5->inputvectorsize_ + 4) = 0;
  pGVar5->outputvectorsize_ = 0;
  pGVar5->sequenceoutput_ = false;
  pGVar5->hasbiasvectors_ = false;
  pGVar5->reverseinput_ = false;
  pGVar5->field_0x83 = 0;
  pGVar5->_cached_size_ = (atomic<int>)0x0;
  *(undefined1 *)&pGVar5->outputgatebiasvector_ = 1;
  iVar21 = 0xf3;
  do {
    if (pGVar5->updategateweightmatrix_ == (WeightParams *)0x0) {
      uVar4 = (pGVar5->super_MessageLite)._internal_metadata_.ptr_;
      pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        pAVar22 = *(Arena **)pAVar22;
      }
      pWVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar22);
      pGVar5->updategateweightmatrix_ = pWVar15;
    }
    pWVar15 = pGVar5->updategateweightmatrix_;
    this_00 = &pWVar15->floatvalue_;
    uVar1 = (pWVar15->floatvalue_).current_size_;
    uVar2 = (pWVar15->floatvalue_).total_size_;
    if (uVar1 == uVar2) {
      google::protobuf::RepeatedField<float>::Reserve(this_00,uVar2 + 1);
    }
    pfVar16 = google::protobuf::RepeatedField<float>::elements(this_00);
    pfVar16[uVar1] = 1.0;
    this_00->current_size_ = uVar1 + 1;
    iVar21 = iVar21 + -1;
  } while (iVar21 != 0);
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar6 = CoreML::Result::good(&local_48);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x6d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)bVar6;
}

Assistant:

int testInvalidConvolution3DNoBias() {

    Specification::Model m1;

    int input_channels = 3;
    int output_channels = 3;
    int kernel_depth = 3;
    int kernel_height = 3;
    int kernel_width = 3;
    int nGroups = 1;
    int stride_depth = 1;
    int stride_height = 1;
    int stride_width = 1;
    int dilation_depth = 1;
    int dilation_height = 1;
    int dilation_width = 1;
    int pad_front = 0;
    int pad_back = 0;
    int pad_top = 0;
    int pad_bottom = 0;
    int pad_left = 0;
    int pad_right = 0;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(3);
    shape->add_shape(32);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution3d();
    params->set_inputchannels(input_channels);
    params->set_outputchannels(output_channels);
    params->set_kerneldepth(kernel_depth);
    params->set_kernelheight(kernel_height);
    params->set_kernelwidth(kernel_width);
    params->set_ngroups(nGroups);
    params->set_stridedepth(stride_depth);
    params->set_strideheight(stride_height);
    params->set_stridewidth(stride_width);
    params->set_dilationdepth(dilation_depth);
    params->set_dilationheight(dilation_height);
    params->set_dilationwidth(dilation_width);
    params->set_paddingtype(CoreML::Specification::Convolution3DLayerParams_PaddingType_CUSTOM);
    params->set_custompaddingfront(pad_front);
    params->set_custompaddingback(pad_back);
    params->set_custompaddingtop(pad_top);
    params->set_custompaddingbottom(pad_bottom);
    params->set_custompaddingleft(pad_left);
    params->set_custompaddingright(pad_right);

    params->set_hasbias(true);

    // Fill Weights
    for (int i = 0; i < output_channels * (input_channels / nGroups) * kernel_depth * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Not specifying any biases should be invalid

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}